

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

uint32_t __thiscall Buffer::CopyAndRemove(Buffer *this,char *out,uint32_t l)

{
  ushort uVar1;
  ushort uVar2;
  char cVar3;
  uint uVar4;
  BufferChain *pBVar5;
  BufferChain *pBVar6;
  uint32_t uVar7;
  ulong uVar8;
  
  if (this->m_head == (BufferChain *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar8 = 0;
    pBVar5 = this->m_head;
    do {
      uVar1 = pBVar5->write;
      uVar2 = pBVar5->read;
      if (uVar1 < uVar2) {
        __assert_fail("write >= read",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/alphavip[P]pollevent/loop/Buffer.cpp"
                      ,0x14,"uint16_t BufferChain::GetCanReadCount()");
      }
      if (uVar1 == uVar2) {
        pBVar6 = pBVar5->nextpkt;
        (*this->_vptr_Buffer[1])(this,pBVar5);
        this->m_head = pBVar6;
        cVar3 = '\x03';
      }
      else {
        uVar4 = (uint)(ushort)(uVar1 - uVar2);
        if (l < uVar4) {
          if (0xfeb < uVar2) {
LAB_00105e44:
            __assert_fail("read < _BUFFER_CHAIN_LEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/alphavip[P]pollevent/loop/Buffer.cpp"
                          ,8,"char *BufferChain::GetReadAddr()");
          }
          memcpy(out + uVar8,pBVar5->chain + uVar2,(ulong)l);
          uVar8 = (ulong)((int)uVar8 + l);
          this->len = this->len - l;
          pBVar5->read = pBVar5->read + (short)l;
          cVar3 = '\x02';
          pBVar6 = pBVar5;
        }
        else {
          if (0xfeb < uVar2) goto LAB_00105e44;
          memcpy(out + uVar8,pBVar5->chain + uVar2,(ulong)uVar4);
          this->len = this->len - uVar4;
          pBVar6 = pBVar5->nextpkt;
          (*this->_vptr_Buffer[1])(this,pBVar5);
          l = l - uVar4;
          this->m_head = pBVar6;
          cVar3 = (l == 0) * '\x02';
          uVar8 = (ulong)((int)uVar8 + uVar4);
        }
      }
      uVar7 = (uint32_t)uVar8;
    } while (((cVar3 == '\x03') || (cVar3 == '\0')) &&
            (pBVar5 = pBVar6, pBVar6 != (BufferChain *)0x0));
  }
  if (this->m_head == (BufferChain *)0x0) {
    this->m_end = (BufferChain *)0x0;
  }
  return uVar7;
}

Assistant:

uint32_t Buffer::CopyAndRemove(char *out, uint32_t l)
{
    uint32_t ret = 0;
    for(BufferChain* buff = this->m_head; buff != nullptr;)
    {
        uint16_t canReadCount = buff->GetCanReadCount();
        if(canReadCount == 0)
        {
            BufferChain* bc = buff->nextpkt;
            Cycle(buff);
            buff = bc;
            m_head = bc;
            continue;
        }

        if(l < canReadCount)
        {
            memcpy(out + ret, buff->GetReadAddr(), l);
            ret += l;
            len -= l;
            buff->read += l;
            break;
        }
        else
        {
            memcpy(out + ret, buff->GetReadAddr(), canReadCount);
            ret += canReadCount;
            l -= canReadCount;
            len -= canReadCount;

            BufferChain* bc = buff->nextpkt;
            Cycle(buff);
            buff = bc;
            m_head = bc;

            if(l == 0)
                break;
        }

    }

    if(m_head == nullptr)
        m_end = nullptr;

    return ret;
}